

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_pppp_flags(DisasContext_conflict1 *s,arg_rprr_s *a,GVecGen4_conflict1 *gvec_op)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  TCGv_i64 arg1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  uint32_t aofs;
  uintptr_t o_1;
  uint32_t dofs;
  uint32_t aofs_00;
  uint32_t bofs;
  uintptr_t o_2;
  int iVar2;
  uint oprsz;
  uintptr_t o;
  uintptr_t o_3;
  uint32_t local_48;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (!_Var1) {
    return _Var1;
  }
  iVar2 = s->sve_len >> 3;
  dofs = a->rd * 0x20 + 0x2c10;
  aofs = a->rn * 0x20 + 0x2c10;
  bofs = a->rm * 0x20 + 0x2c10;
  aofs_00 = a->pg * 0x20 + 0x2c10;
  if (iVar2 < 9) {
    arg1 = tcg_temp_new_i64(tcg_ctx);
    ret = tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    ret_01 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ld_i64_aarch64(tcg_ctx,ret,tcg_ctx->cpu_env,(long)(int)aofs);
    tcg_gen_ld_i64_aarch64(tcg_ctx,ret_00,tcg_ctx->cpu_env,(long)(int)bofs);
    tcg_gen_ld_i64_aarch64(tcg_ctx,ret_01,tcg_ctx->cpu_env,(long)(int)aofs_00);
    (*gvec_op->fni8)(tcg_ctx,arg1,ret,ret_00,ret_01);
    tcg_gen_st_i64_aarch64(tcg_ctx,arg1,tcg_ctx->cpu_env,(long)(int)dofs);
    do_predtest1(tcg_ctx,arg1,ret_01);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
    return (_Bool)extraout_AL;
  }
  oprsz = iVar2 + 0xfU & 0x7ffffff0;
  local_48 = aofs_00;
  if (a->rd == a->pg) {
    local_48 = 0x2e30;
    tcg_gen_gvec_mov_aarch64(tcg_ctx,0,0x2e30,aofs_00,oprsz,oprsz);
  }
  tcg_gen_gvec_4_aarch64(tcg_ctx,dofs,aofs,bofs,aofs_00,oprsz,oprsz,gvec_op);
  do_predtest(s,dofs,local_48,oprsz >> 3);
  return (_Bool)extraout_AL_00;
}

Assistant:

static bool do_pppp_flags(DisasContext *s, arg_rprr_s *a,
                          const GVecGen4 *gvec_op)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned psz = pred_gvec_reg_size(s);
    int dofs = pred_full_reg_offset(s, a->rd);
    int nofs = pred_full_reg_offset(s, a->rn);
    int mofs = pred_full_reg_offset(s, a->rm);
    int gofs = pred_full_reg_offset(s, a->pg);

    if (psz == 8) {
        /* Do the operation and the flags generation in temps.  */
        TCGv_i64 pd = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 pn = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 pm = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 pg = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_ld_i64(tcg_ctx, pn, tcg_ctx->cpu_env, nofs);
        tcg_gen_ld_i64(tcg_ctx, pm, tcg_ctx->cpu_env, mofs);
        tcg_gen_ld_i64(tcg_ctx, pg, tcg_ctx->cpu_env, gofs);

        gvec_op->fni8(tcg_ctx, pd, pn, pm, pg);
        tcg_gen_st_i64(tcg_ctx, pd, tcg_ctx->cpu_env, dofs);

        do_predtest1(tcg_ctx, pd, pg);

        tcg_temp_free_i64(tcg_ctx, pd);
        tcg_temp_free_i64(tcg_ctx, pn);
        tcg_temp_free_i64(tcg_ctx, pm);
        tcg_temp_free_i64(tcg_ctx, pg);
    } else {
        /* The operation and flags generation is large.  The computation
         * of the flags depends on the original contents of the guarding
         * predicate.  If the destination overwrites the guarding predicate,
         * then the easiest way to get this right is to save a copy.
          */
        int tofs = gofs;
        if (a->rd == a->pg) {
            tofs = offsetof(CPUARMState, vfp.preg_tmp);
            tcg_gen_gvec_mov(tcg_ctx, 0, tofs, gofs, psz, psz);
        }

        tcg_gen_gvec_4(tcg_ctx, dofs, nofs, mofs, gofs, psz, psz, gvec_op);
        do_predtest(s, dofs, tofs, psz / 8);
    }
    return true;
}